

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecrt.cpp
# Opt level: O0

char * PAL_fgets(char *sz,int nSize,PAL_FILE *pf)

{
  char *local_28;
  char *szBuf;
  PAL_FILE *pf_local;
  int nSize_local;
  char *sz_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (pf == (PAL_FILE *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = CorUnix::InternalFgets(sz,nSize,pf->bsdFilePtr,pf->bTextMode != 0);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_28;
}

Assistant:

char *
__cdecl
PAL_fgets(
    char *sz,
    int nSize,
    PAL_FILE *pf
    )
{
    char * szBuf;

    PERF_ENTRY(fgets);
    ENTRY( "fgets(sz=%p (%s) nSize=%d pf=%p)\n", sz, sz, nSize, pf);

    if (pf != NULL)
    {
        szBuf = InternalFgets(sz, nSize, pf->bsdFilePtr, pf->bTextMode);
    }
    else
    {
        szBuf = NULL;
    }

    LOGEXIT("fgets() returns %p\n", szBuf);
    PERF_EXIT(fgets);

    return szBuf;
}